

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O3

LogicalTypeComparisonResult duckdb::RequiresCast(LogicalType *source_type,LogicalType *target_type)

{
  bool bVar1;
  
  if (target_type->id_ == ANY) {
    return TARGET_IS_ANY;
  }
  do {
    bVar1 = LogicalType::operator==(source_type,target_type);
    if (bVar1) {
      return IDENTICAL_TYPE;
    }
    if (source_type->id_ == ARRAY) {
      if (target_type->id_ != ARRAY) {
        return DIFFERENT_TYPES;
      }
      source_type = ArrayType::GetChildType(source_type);
      target_type = ArrayType::GetChildType(target_type);
    }
    else {
      if (source_type->id_ != LIST) {
        return DIFFERENT_TYPES;
      }
      if (target_type->id_ != LIST) {
        return DIFFERENT_TYPES;
      }
      source_type = ListType::GetChildType(source_type);
      target_type = ListType::GetChildType(target_type);
    }
    if (target_type->id_ == ANY) {
      return TARGET_IS_ANY;
    }
  } while( true );
}

Assistant:

LogicalTypeComparisonResult RequiresCast(const LogicalType &source_type, const LogicalType &target_type) {
	if (target_type.id() == LogicalTypeId::ANY) {
		return LogicalTypeComparisonResult::TARGET_IS_ANY;
	}
	if (source_type == target_type) {
		return LogicalTypeComparisonResult::IDENTICAL_TYPE;
	}
	if (source_type.id() == LogicalTypeId::LIST && target_type.id() == LogicalTypeId::LIST) {
		return RequiresCast(ListType::GetChildType(source_type), ListType::GetChildType(target_type));
	}
	if (source_type.id() == LogicalTypeId::ARRAY && target_type.id() == LogicalTypeId::ARRAY) {
		return RequiresCast(ArrayType::GetChildType(source_type), ArrayType::GetChildType(target_type));
	}
	return LogicalTypeComparisonResult::DIFFERENT_TYPES;
}